

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

void __thiscall SQSharedState::RunMark(SQSharedState *this,SQVM *vm,SQCollectable_conflict **tchain)

{
  SQTable *pSVar1;
  
  pSVar1 = (this->_root_vm).super_SQObject._unVal.pTable;
  (*(pSVar1->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[4])
            (pSVar1,tchain);
  RefTable::Mark(&this->_refs_table,tchain);
  MarkObject(&this->_registry,tchain);
  MarkObject(&this->_consts,tchain);
  MarkObject(&this->_metamethodsmap,tchain);
  MarkObject(&this->_table_default_delegate,tchain);
  MarkObject(&this->_array_default_delegate,tchain);
  MarkObject(&this->_string_default_delegate,tchain);
  MarkObject(&this->_number_default_delegate,tchain);
  MarkObject(&this->_generator_default_delegate,tchain);
  MarkObject(&this->_thread_default_delegate,tchain);
  MarkObject(&this->_closure_default_delegate,tchain);
  MarkObject(&this->_class_default_delegate,tchain);
  MarkObject(&this->_instance_default_delegate,tchain);
  MarkObject(&this->_weakref_default_delegate,tchain);
  return;
}

Assistant:

void SQSharedState::RunMark(SQVM* SQ_UNUSED_ARG(vm),SQCollectable **tchain)
{
    SQVM *vms = _thread(_root_vm);

    vms->Mark(tchain);

    _refs_table.Mark(tchain);
    MarkObject(_registry,tchain);
    MarkObject(_consts,tchain);
    MarkObject(_metamethodsmap,tchain);
    MarkObject(_table_default_delegate,tchain);
    MarkObject(_array_default_delegate,tchain);
    MarkObject(_string_default_delegate,tchain);
    MarkObject(_number_default_delegate,tchain);
    MarkObject(_generator_default_delegate,tchain);
    MarkObject(_thread_default_delegate,tchain);
    MarkObject(_closure_default_delegate,tchain);
    MarkObject(_class_default_delegate,tchain);
    MarkObject(_instance_default_delegate,tchain);
    MarkObject(_weakref_default_delegate,tchain);

}